

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_write_image(png_structrp png_ptr,png_bytepp image)

{
  int iVar1;
  png_bytepp local_30;
  png_bytepp rp;
  int local_20;
  int num_pass;
  int pass;
  png_uint_32 i;
  png_bytepp image_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    iVar1 = png_set_interlace_handling(png_ptr);
    for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
      local_30 = image;
      for (num_pass = 0; (uint)num_pass < png_ptr->height; num_pass = num_pass + 1) {
        png_write_row(png_ptr,*local_30);
        local_30 = local_30 + 1;
      }
    }
  }
  return;
}

Assistant:

void PNGAPI
png_write_image(png_structrp png_ptr, png_bytepp image)
{
   png_uint_32 i; /* row index */
   int pass, num_pass; /* pass variables */
   png_bytepp rp; /* points to current row */

   if (png_ptr == NULL)
      return;

   png_debug(1, "in png_write_image");

#ifdef PNG_WRITE_INTERLACING_SUPPORTED
   /* Initialize interlace handling.  If image is not interlaced,
    * this will set pass to 1
    */
   num_pass = png_set_interlace_handling(png_ptr);
#else
   num_pass = 1;
#endif
   /* Loop through passes */
   for (pass = 0; pass < num_pass; pass++)
   {
      /* Loop through image */
      for (i = 0, rp = image; i < png_ptr->height; i++, rp++)
      {
         png_write_row(png_ptr, *rp);
      }
   }
}